

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::EncodeDecodeTest_DecodeDeterministicOutput_Test::
TestBody(EncodeDecodeTest_DecodeDeterministicOutput_Test *this)

{
  bool bVar1;
  char *message;
  AlphaNum *in_RCX;
  char *in_R9;
  string_view local_140;
  string local_130;
  AssertHelper local_110;
  Message local_108;
  allocator<char> local_f9;
  string local_f8;
  bool local_d1;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  AlphaNum local_60;
  undefined1 local_30 [8];
  string golden_path;
  EncodeDecodeTest_DecodeDeterministicOutput_Test *this_local;
  
  golden_path.field_2._8_8_ = this;
  TestTempDir_abi_cxx11_();
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_60,&local_80);
  absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)&gtest_ar_.message_,"/golden_message");
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_30,(lts_20250127 *)&local_60,(AlphaNum *)&gtest_ar_.message_,in_RCX);
  std::__cxx11::string::~string((string *)&local_80);
  WriteGoldenMessage((string *)local_30);
  EncodeDecodeTest::RedirectStdinFromFile(&this->super_EncodeDecodeTest,(string *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,
             "google/protobuf/unittest.proto --decode=proto2_unittest.TestAllTypes --deterministic_output"
             ,&local_f9);
  bVar1 = EncodeDecodeTest::Run(&this->super_EncodeDecodeTest,&local_f8,true);
  local_d1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d0,&local_d1,(type *)0x0)
  ;
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_130,(internal *)local_d0,
               (AssertionResult *)
               "Run(\"google/protobuf/unittest.proto\" \" --decode=proto2_unittest.TestAllTypes --deterministic_output\")"
               ,"true","false",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
               ,0x1219,message);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_140,"Can only use --deterministic_output with --encode.");
  EncodeDecodeTest::ExpectError(&this->super_EncodeDecodeTest,local_140);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_P(EncodeDecodeTest, DecodeDeterministicOutput) {
  std::string golden_path = absl::StrCat(TestTempDir(), "/golden_message");
  WriteGoldenMessage(golden_path);
  RedirectStdinFromFile(golden_path);
  EXPECT_FALSE(
      Run("google/protobuf/unittest.proto"
          " --decode=proto2_unittest.TestAllTypes --deterministic_output"));
  ExpectError("Can only use --deterministic_output with --encode.");
}